

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsencoding.h
# Opt level: O3

void vsencoding::__vseblocks_unpack11(uint32_t *out,uint32_t *in,uint32_t bs)

{
  undefined8 uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [16];
  uint uVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [16];
  undefined1 auVar22 [64];
  
  if (0x1f < bs + 0x1f) {
    auVar16 = vpmovsxbd_avx512f(_DAT_00194540);
    auVar17 = vpmovsxbd_avx512f(_DAT_00194550);
    auVar6 = vpmovsxbd_avx(ZEXT416(0x3040102));
    auVar9 = vpmovsxwd_avx(ZEXT816(0x7f807f007fe07fc));
    auVar18 = vpbroadcastd_avx512f(ZEXT416(0x7ff));
    auVar7 = vpmovsxbd_avx(ZEXT416(0x807));
    auVar12 = vpmovsxbq_avx2(ZEXT416(0x1000008));
    auVar10 = vpmovsxbd_avx2(ZEXT816(0x404010101000000));
    auVar11 = vpmovsxbd_avx2(ZEXT816(0xd18030e19040f1a));
    auVar8 = vpmovsxbd_avx(ZEXT416(0x10c1702));
    uVar14 = bs + 0x1f >> 5;
    do {
      uVar1 = *(undefined8 *)*(undefined1 (*) [16])((long)in + 0x10);
      auVar3 = *(undefined1 (*) [16])in;
      uVar4 = *(uint *)(*(undefined1 (*) [16])((long)in + 0x20) + 8);
      *out = *(uint *)*(undefined1 (*) [16])in >> 0x15;
      auVar23 = vpshufd_avx(auVar3,0xb1);
      auVar19 = vpermt2d_avx512f(ZEXT1664(auVar3),auVar16,ZEXT1664(CONCAT88(uVar1,uVar1)));
      auVar3 = vpsllvd_avx2(auVar23,auVar6);
      auVar3 = vpand_avx(auVar3,auVar9);
      auVar20 = vshufi64x2_avx512f(ZEXT1664(auVar3),ZEXT1664(auVar3),0);
      auVar19 = vpsrlvd_avx512f(auVar19,auVar17);
      auVar21 = vpbroadcastd_avx512f();
      auVar22._0_52_ = auVar20._0_52_;
      auVar22._52_4_ = auVar21._52_4_;
      auVar22._56_4_ = auVar20._56_4_;
      auVar22._60_4_ = auVar20._60_4_;
      uVar5 = *(ulong *)*(undefined1 (*) [16])((long)in + 0x20);
      auVar20 = vpandd_avx512f(auVar19,auVar18);
      auVar19 = vpord_avx512f(auVar19,auVar22);
      auVar21._4_4_ = auVar19._4_4_;
      auVar21._0_4_ = auVar20._0_4_;
      auVar21._8_4_ = auVar20._8_4_;
      auVar21._12_4_ = auVar20._12_4_;
      auVar21._16_4_ = auVar19._16_4_;
      auVar21._20_4_ = auVar20._20_4_;
      auVar21._24_4_ = auVar20._24_4_;
      auVar21._28_4_ = auVar19._28_4_;
      auVar21._32_4_ = auVar20._32_4_;
      auVar21._36_4_ = auVar20._36_4_;
      auVar21._40_4_ = auVar19._40_4_;
      auVar21._44_4_ = auVar20._44_4_;
      auVar21._48_4_ = auVar20._48_4_;
      auVar21._52_4_ = auVar19._52_4_;
      auVar21._56_4_ = auVar20._56_4_;
      auVar21._60_4_ = auVar20._60_4_;
      uVar2 = *(ulong *)(*(undefined1 (*) [16])((long)in + 0x10) + 8);
      in = (uint32_t *)(*(undefined1 (*) [16])((long)in + 0x20) + 0xc);
      auVar19 = vmovdqu64_avx512f(auVar21);
      *(undefined1 (*) [64])(out + 1) = auVar19;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = uVar5;
      auVar3 = vpshufd_avx(auVar25,0x54);
      auVar13 = vpsrlvd_avx2(auVar3,auVar8);
      auVar23._8_8_ = 0;
      auVar23._0_8_ = uVar2;
      auVar3 = vpsllvd_avx2(auVar23,auVar7);
      auVar24._0_16_ = ZEXT116(0) * auVar25 + ZEXT116(1) * auVar23;
      auVar24._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar25;
      auVar3 = vpand_avx(auVar3,ZEXT816(0x70000000780));
      auVar24 = vpermd_avx2(auVar10,auVar24);
      auVar15 = vpermt2d_avx512vl(ZEXT1632(auVar3),auVar12,
                                  ZEXT432(((uint)((ulong)uVar1 >> 0x20) & 0x1f) << 6));
      auVar24 = vpsrlvd_avx2(auVar24,auVar11);
      auVar15 = vpor_avx2(auVar24,auVar15);
      auVar24 = vpand_avx2(auVar24,auVar18._0_32_);
      auVar24 = vpblendd_avx2(auVar24,auVar15,0x49);
      auVar3 = vpand_avx(auVar13,auVar18._0_16_);
      *(undefined1 (*) [32])(out + 0x11) = auVar24;
      auVar23 = vpinsrd_avx(auVar18._0_16_,((uint)uVar5 & 3) << 9,1);
      auVar23 = vpor_avx(auVar13,auVar23);
      auVar3 = vpblendd_avx2(auVar3,auVar23,2);
      *(undefined1 (*) [16])(out + 0x19) = auVar3;
      out[0x1d] = ((uint)(uVar5 >> 0x20) & 1) << 10 | uVar4 >> 0x16;
      out[0x1e] = uVar4 >> 0xb & 0x7ff;
      out[0x1f] = uVar4 & 0x7ff;
      out = out + 0x20;
      uVar14 = uVar14 - 1;
    } while (uVar14 != 0);
  }
  return;
}

Assistant:

void __vseblocks_unpack11(uint32_t *__restrict__ out,
                          const uint32_t *__restrict__ in, uint32_t bs) {
  for (bs = (bs + 31U) / 32U; bs > 0; out += 32, in += 11, --bs) {
    out[0] = in[0] >> 21;
    out[1] = (in[0] >> 10) & 0x07ff;
    out[2] = (in[0] << 1) & 0x07ff;
    out[2] |= in[1] >> 31;
    out[3] = (in[1] >> 20) & 0x07ff;
    out[4] = (in[1] >> 9) & 0x07ff;
    out[5] = (in[1] << 2) & 0x07ff;
    out[5] |= in[2] >> 30;
    out[6] = (in[2] >> 19) & 0x07ff;
    out[7] = (in[2] >> 8) & 0x07ff;
    out[8] = (in[2] << 3) & 0x07ff;
    out[8] |= in[3] >> 29;
    out[9] = (in[3] >> 18) & 0x07ff;
    out[10] = (in[3] >> 7) & 0x07ff;
    out[11] = (in[3] << 4) & 0x07ff;
    out[11] |= in[4] >> 28;
    out[12] = (in[4] >> 17) & 0x07ff;
    out[13] = (in[4] >> 6) & 0x07ff;
    out[14] = (in[4] << 5) & 0x07ff;
    out[14] |= in[5] >> 27;
    out[15] = (in[5] >> 16) & 0x07ff;
    out[16] = (in[5] >> 5) & 0x07ff;
    out[17] = (in[5] << 6) & 0x07ff;
    out[17] |= in[6] >> 26;
    out[18] = (in[6] >> 15) & 0x07ff;
    out[19] = (in[6] >> 4) & 0x07ff;
    out[20] = (in[6] << 7) & 0x07ff;
    out[20] |= in[7] >> 25;
    out[21] = (in[7] >> 14) & 0x07ff;
    out[22] = (in[7] >> 3) & 0x07ff;
    out[23] = (in[7] << 8) & 0x07ff;
    out[23] |= in[8] >> 24;
    out[24] = (in[8] >> 13) & 0x07ff;
    out[25] = (in[8] >> 2) & 0x07ff;
    out[26] = (in[8] << 9) & 0x07ff;
    out[26] |= in[9] >> 23;
    out[27] = (in[9] >> 12) & 0x07ff;
    out[28] = (in[9] >> 1) & 0x07ff;
    out[29] = (in[9] << 10) & 0x07ff;
    out[29] |= in[10] >> 22;
    out[30] = (in[10] >> 11) & 0x07ff;
    out[31] = in[10] & 0x07ff;
  }
}